

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O0

int equal_pathway(pathway_t *a,pathway_t *b)

{
  int iVar1;
  bool local_19;
  pathway_t *b_local;
  pathway_t *a_local;
  
  iVar1 = strcmp(a->id,b->id);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->from_stop_id,b->from_stop_id);
    local_19 = false;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->to_stop_id,b->to_stop_id);
      local_19 = false;
      if (iVar1 == 0) {
        iVar1 = strcmp(a->signposted_as,b->signposted_as);
        local_19 = false;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->reversed_signposted_as,b->reversed_signposted_as);
          local_19 = false;
          if (((iVar1 == 0) && (local_19 = false, a->mode == b->mode)) &&
             (local_19 = false, a->is_bidirectional == b->is_bidirectional)) {
            local_19 = false;
            if (((a->length == b->length) && (!NAN(a->length) && !NAN(b->length))) &&
               ((local_19 = false, a->traversal_time == b->traversal_time &&
                (local_19 = false, a->stair_count == b->stair_count)))) {
              local_19 = false;
              if ((a->max_slope == b->max_slope) && (!NAN(a->max_slope) && !NAN(b->max_slope))) {
                local_19 = a->min_width == b->min_width;
              }
            }
          }
        }
      }
    }
  }
  return (int)local_19;
}

Assistant:

int equal_pathway(const pathway_t *a, const pathway_t *b) {
    return (!strcmp(a->id, b->id) &&
             !strcmp(a->from_stop_id, b->from_stop_id) &&
             !strcmp(a->to_stop_id, b->to_stop_id) &&
             !strcmp(a->signposted_as, b->signposted_as) &&
             !strcmp(a->reversed_signposted_as, b->reversed_signposted_as) &&
             a->mode == b->mode &&
             a->is_bidirectional == b->is_bidirectional &&
             a->length == b->length &&
             a->traversal_time == b->traversal_time &&
             a->stair_count == b->stair_count &&
             a->max_slope == b->max_slope &&
             a->min_width == b->min_width);
}